

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  this_00 = &this->os_->stack_;
  pcVar2 = this_00->stackTop_;
  pcVar3 = this_00->stackEnd_;
  if (pcVar3 < pcVar2 + 4) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
    this_00 = &this->os_->stack_;
    pcVar2 = this_00->stackTop_;
    pcVar3 = this_00->stackEnd_;
  }
  if (pcVar2 + 1 <= pcVar3) {
    this_00->stackTop_ = pcVar2 + 1;
    *pcVar2 = 'n';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if (pcVar2 <= (pGVar1->stack_).stackEnd_) {
      (pGVar1->stack_).stackTop_ = pcVar2;
      *pcVar3 = 'u';
      pGVar1 = this->os_;
      pcVar3 = (pGVar1->stack_).stackTop_;
      pcVar2 = pcVar3 + 1;
      if (pcVar2 <= (pGVar1->stack_).stackEnd_) {
        (pGVar1->stack_).stackTop_ = pcVar2;
        *pcVar3 = 'l';
        pGVar1 = this->os_;
        pcVar3 = (pGVar1->stack_).stackTop_;
        pcVar2 = pcVar3 + 1;
        if (pcVar2 <= (pGVar1->stack_).stackEnd_) {
          (pGVar1->stack_).stackTop_ = pcVar2;
          *pcVar3 = 'l';
          return true;
        }
      }
    }
  }
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }